

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FactorisedJoin.cpp
# Opt level: O3

bool __thiscall
FactorisedJoin::seekValue
          (FactorisedJoin *this,DTreeNode *node,int *rel,int *ordering,int numOfRel,int **l,int *u,
          double *val)

{
  Database pTVar1;
  pointer ppVar2;
  int *piVar3;
  long lVar4;
  ulong uVar5;
  int iVar6;
  pointer ppdVar7;
  uint uVar8;
  int iVar9;
  ulong uVar10;
  long lVar11;
  uint *puVar12;
  uint uVar13;
  double dVar14;
  double dVar15;
  
  iVar6 = (*rel + -1) % numOfRel;
  pTVar1 = this->_data;
  ppVar2 = this->_ids[node->_id].
           super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
           super__Vector_impl_data._M_start;
  piVar3 = *l;
  dVar14 = pTVar1[ppVar2[ordering[(iVar6 >> 0x1f & numOfRel) + iVar6]].first].
           super__Vector_base<double_*,_std::allocator<double_*>_>._M_impl.super__Vector_impl_data.
           _M_start[piVar3[ppVar2[ordering[(iVar6 >> 0x1f & numOfRel) + iVar6]].first]]
           [ppVar2[ordering[(iVar6 >> 0x1f & numOfRel) + iVar6]].second];
  lVar11 = (long)ppVar2[ordering[*rel]].first;
  lVar4 = (long)ppVar2[ordering[*rel]].second;
  uVar5 = (ulong)piVar3[lVar11];
  ppdVar7 = pTVar1[lVar11].super__Vector_base<double_*,_std::allocator<double_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  dVar15 = ppdVar7[uVar5][lVar4];
  if ((dVar15 != dVar14) || (NAN(dVar15) || NAN(dVar14))) {
    puVar12 = (uint *)(piVar3 + lVar11);
    do {
      uVar13 = (uint)uVar5;
      uVar10 = (ulong)u[lVar11];
      if (ppdVar7[uVar10][lVar4] <= dVar14 && dVar14 != ppdVar7[uVar10][lVar4]) {
        return true;
      }
      if (((int)uVar13 <= u[lVar11]) && (dVar15 < dVar14)) {
        iVar6 = 1;
        while( true ) {
          uVar13 = (int)uVar5 + iVar6;
          uVar8 = (uint)uVar10;
          if ((int)uVar8 <= (int)uVar13) break;
          *puVar12 = uVar13;
          iVar6 = iVar6 << (ppdVar7[(int)uVar13][lVar4] < dVar14);
          uVar10 = (ulong)(uint)u[lVar11];
          if ((u[lVar11] < (int)uVar13) ||
             (uVar5 = (ulong)uVar13, dVar14 <= ppdVar7[(int)uVar13][lVar4])) goto LAB_0011f7f0;
        }
        iVar6 = uVar8 - (int)uVar5;
        *puVar12 = uVar8;
        uVar13 = uVar8;
LAB_0011f7f0:
        if ((1 < iVar6) && (dVar14 <= ppdVar7[(long)(int)uVar13 + -1][lVar4])) {
          iVar6 = uVar13 - iVar6;
          do {
            iVar9 = (int)(iVar6 + uVar13) / 2;
            if ((ppdVar7[(long)iVar9 + -1][lVar4] <= dVar14 &&
                 dVar14 != ppdVar7[(long)iVar9 + -1][lVar4]) && (dVar14 <= ppdVar7[iVar9][lVar4]))
            break;
            if (ppdVar7[iVar9][lVar4] < dVar14) {
              iVar6 = iVar9 + 1;
            }
            else {
              uVar13 = iVar9 - 1;
            }
          } while (iVar6 < (int)uVar13);
          uVar13 = (int)(uVar13 + iVar6) / 2;
          if (dVar14 <= ppdVar7[(long)(int)uVar13 + -1][lVar4]) {
            uVar13 = uVar13 - 1;
          }
          *puVar12 = uVar13;
        }
      }
      dVar14 = ppdVar7[(int)uVar13][lVar4];
      iVar6 = (*rel + 1) % numOfRel;
      *rel = iVar6;
      lVar11 = (long)ppVar2[ordering[iVar6]].first;
      lVar4 = (long)ppVar2[ordering[iVar6]].second;
      puVar12 = (uint *)(piVar3 + lVar11);
      uVar5 = (ulong)(int)*puVar12;
      ppdVar7 = pTVar1[lVar11].super__Vector_base<double_*,_std::allocator<double_*>_>._M_impl.
                super__Vector_impl_data._M_start;
      dVar15 = ppdVar7[uVar5][lVar4];
    } while ((dVar15 != dVar14) || (NAN(dVar15) || NAN(dVar14)));
  }
  *val = dVar15;
  return false;
}

Assistant:

bool FactorisedJoin::seekValue(DTreeNode* node, int &rel, int* ordering, int numOfRel,
                               int* &l, int* u, double &val)
{
    int nodeID = node->_id;

    int index = mod(rel - 1, numOfRel);
    int i = _ids[nodeID][ordering[index]].first;
    int j = _ids[nodeID][ordering[index]].second;

    /* this is the value we are seeking. */
    double max = _data[i][l[i]][j];

    double min;
    while (true)
    {
        i = _ids[nodeID][ordering[rel]].first;
        j = _ids[nodeID][ordering[rel]].second;
        min = _data[i][l[i]][j];

        /* If we found the value then we return. */
        if (min == max)
        {
            val = min;
            return false;
        }
        /* else we seek a the least upper bound */
        else
        {
            /* If the value we seek is bigger than the last value in the
             * relation we can return. */
            if (max > _data[i][u[i]][j])
                return true;

            /* We seek the value with increasing leaps. */
            int leap = 1;
            while (l[i] <= u[i] && min < max)
            {
                if (l[i] + leap < u[i])
                {
                    l[i] += leap;
                    min = _data[i][l[i]][j];
                    if (min < max)
                        leap *= 2;
                }
                else
                {
                    leap = u[i] - l[i];
                    l[i] = u[i];
                    min = _data[i][l[i]][j];
                    break;
                }
            }

            /*
             * When we found an upper bound we need to find the least upper bound;
             * we backtrack using binary search.
             */
            if (leap > 1 && max <= _data[i][l[i] - 1][j])
            {
                int high = l[i], low = l[i] - leap, mid = 0;
                while (high > low && high != low)
                {
                    mid = (high + low) / 2;
                    if (max > _data[i][mid - 1][j] && max <= _data[i][mid][j])
                    {
                        l[i] = mid;
                        break;
                    }
                    else if (max <= _data[i][mid][j])
                        high = mid - 1;
                    else
                        low = mid + 1;
                }

                mid = (high + low) / 2;
                if (_data[i][mid - 1][j] >= max)
                    mid -= 1;

                l[i] = mid;
            }

            /*
             * Once the least upper bound is found we set max to that value and
             * continue with the next relation.
             */
            max = _data[i][l[i]][j];
            rel = (rel + 1) % numOfRel;
        }
    }

    return false;
}